

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_logger_print_failures(fct_nlist_t *fail_list)

{
  size_t sVar1;
  void *pvVar2;
  char *cndtn_str;
  size_t num_itemscndtn_str;
  size_t item_icndtn_str;
  fct_nlist_t *fail_list_local;
  
  puts("\n----------------------------------------------------------------------------\n");
  puts("FAILED TESTS\n\n");
  if (fail_list != (fct_nlist_t *)0x0) {
    sVar1 = fct_nlist__size(fail_list);
    for (num_itemscndtn_str = 0; num_itemscndtn_str != sVar1;
        num_itemscndtn_str = num_itemscndtn_str + 1) {
      pvVar2 = fct_nlist__at(fail_list,num_itemscndtn_str);
      printf("%s\n",pvVar2);
    }
  }
  puts("\n");
  return;
}

Assistant:

static void
fct_logger_print_failures(fct_nlist_t const *fail_list)
{
    puts(
        "\n----------------------------------------------------------------------------\n"
    );
    puts("FAILED TESTS\n\n");
    FCT_NLIST_FOREACH_BGN(char *, cndtn_str, fail_list)
    {
        printf("%s\n", cndtn_str);
    }
    FCT_NLIST_FOREACH_END();

    puts("\n");
}